

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void fight_prog_geulgon(CHAR_DATA *mob,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *ch;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  int in_stack_0000120c;
  void *in_stack_00001210;
  CHAR_DATA *in_stack_00001218;
  int in_stack_00001220;
  int in_stack_00001224;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  CHAR_DATA *bch;
  void *in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar3;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  CHAR_DATA *ach;
  
  bch = in_RDI->master;
  if (((in_RDI->fighting != (CHAR_DATA *)0x0) && (in_RSI != (void *)0x0)) &&
     (iVar2 = number_percent(), 0x4a < iVar2)) {
    iVar2 = number_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (iVar2 == 1) {
      skill_lookup((char *)bch);
      spell_energy_drain(unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,
                         (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    }
    else if (iVar2 - 2U < 2) {
      skill_lookup((char *)bch);
      spell_vampiric_touch
                ((int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_ffffffffffffffe8,
                 in_stack_ffffffffffffffe0,(int)((ulong)bch >> 0x20));
    }
    else if (iVar2 - 4U < 2) {
      pCVar3 = in_RDI->in_room->people;
      while (ach = pCVar3, ach != (CHAR_DATA *)0x0) {
        pCVar3 = ach->next_in_room;
        bVar1 = is_same_group(ach,bch);
        if (((!bVar1) && ((bch->cabal < 1 || (bch->cabal != ach->cabal)))) &&
           ((bVar1 = is_safe((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)), !bVar1
            || ((ach->fighting == (CHAR_DATA *)0x0 || (ach->fighting == bch)))))) {
          skill_lookup((char *)bch);
          spell_iceball(in_stack_00001224,in_stack_00001220,in_stack_00001218,in_stack_00001210,
                        in_stack_0000120c);
        }
      }
    }
  }
  return;
}

Assistant:

void fight_prog_geulgon(CHAR_DATA *mob, CHAR_DATA *victim)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	CHAR_DATA *ch = mob->master;
	if (mob->fighting == nullptr)
		return;

	if (!victim)
		return;

	if (number_percent() < 75)
		return;

	switch (number_range(1, 5))
	{
		case 1:
			spell_energy_drain(skill_lookup("energy drain"), mob->level, mob, victim, TAR_CHAR_OFFENSIVE);
			break;
		case 2:
		case 3:
			spell_vampiric_touch(skill_lookup("vampiric touch"), mob->level, mob, victim, TAR_CHAR_OFFENSIVE);
			break;
		case 4:
		case 5:
			for (vch = mob->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (is_same_group(vch, ch))
					continue;

				if (ch->cabal > 0 && ch->cabal == vch->cabal)
					continue;

				if (is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch)
					continue;

				spell_iceball(skill_lookup("iceball"), mob->level, mob, vch, TAR_IGNORE);
			}

			break;
	}
}